

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMullMusashi<(moira::Core)2,(moira::Instr)156,(moira::Mode)11,4>
          (Moira *this,u16 opcode)

{
  uint op2;
  u32 uVar1;
  u32 op1;
  u64 uVar2;
  ulong uVar3;
  
  uVar1 = readI<(moira::Core)2,2>(this);
  uVar3 = (ulong)(uVar1 >> 0xc & 7);
  op1 = readI<(moira::Core)2,4>(this);
  prefetch<(moira::Core)2,4ull>(this);
  op2 = *(uint *)((long)&(this->reg).field_3 + uVar3 * 4);
  switch(uVar1 >> 10 & 3) {
  case 0:
    uVar2 = mullu<(moira::Core)2,2>(this,op1,op2);
    goto LAB_002e6ef1;
  case 1:
    uVar2 = (ulong)op2 * (ulong)op1;
    (this->reg).sr.n = SUB81(uVar2 >> 0x3f,0);
    (this->reg).sr.z = uVar2 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    break;
  case 2:
    uVar2 = mulls<(moira::Core)2,2>(this,op1,op2);
    goto LAB_002e6ef1;
  case 3:
    uVar2 = mulls<(moira::Core)2,4>(this,op1,op2);
  }
  *(int *)((long)&(this->reg).field_3 + (ulong)(uVar1 & 7) * 4) = (int)(uVar2 >> 0x20);
LAB_002e6ef1:
  *(int *)((long)&(this->reg).field_3 + uVar3 * 4) = (int)uVar2;
  return;
}

Assistant:

void
Moira::execMullMusashi(u16 opcode)
{
    u64 result;
    u32 ea, data;
    u16 ext = (u16)readI<C, Word>();

    int src = _____________xxx(opcode);
    int dh  = _____________xxx(ext);
    int dl  = _xxx____________(ext);

    readOp<C, M, S>(src, &ea, &data);

    prefetch<C, POLL>();

    switch (____xx__________(ext)) {

        case 0b00:

            result = mullu<C, Word>(data, readD(dl));
            writeD(dl, u32(result));
            break;

        case 0b01:

            result = mullu<C, Long>(data, readD(dl));
            writeD(dh, u32(result >> 32));
            writeD(dl, u32(result));
            break;

        case 0b10:

            result = mulls<C, Word>(data, readD(dl));
            writeD(dl, u32(result));
            break;

        case 0b11:

            result = mulls<C, Long>(data, readD(dl));
            writeD(dh, u32(result >> 32));
            writeD(dl, u32(result));
            break;
    }
}